

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O1

double __thiscall asl::Log::log(Log *this,double __x)

{
  bool bVar1;
  bool bVar2;
  pthread_mutex_t *__mutex;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  Long LVar6;
  int *piVar7;
  int *in_RCX;
  char *pcVar8;
  int in_EDX;
  int *piVar9;
  Color color;
  String *in_RSI;
  anon_union_16_2_78e7fdac_for_String_2 *paVar10;
  undefined8 uVar11;
  int iVar12;
  byte bVar13;
  uint uVar14;
  int i;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar15;
  String line;
  String oldfile;
  String logfile;
  String catg;
  Date now;
  String local_180;
  int *local_168;
  String local_160;
  String local_148;
  undefined1 local_130 [32];
  Long local_110;
  undefined1 local_e8 [24];
  String local_d0;
  Date local_b8;
  String local_b0;
  Path local_98;
  Date local_80;
  File local_78;
  
  updateState(this);
  if (this->_maxLevel < in_EDX) {
    return extraout_XMM0_Qa;
  }
  Date::now();
  if (in_RSI->_size == 0) {
    paVar10 = &in_RSI->field_2;
  }
  else {
    paVar10 = (anon_union_16_2_78e7fdac_for_String_2 *)(in_RSI->field_2)._str;
  }
  local_168 = in_RCX;
  pcVar5 = strrchr(paVar10->_space,0x5c);
  iVar12 = (int)paVar10;
  uVar14 = -(uint)(pcVar5 == (char *)0x0) | (int)pcVar5 - iVar12;
  pcVar5 = strrchr(paVar10->_space,0x2f);
  uVar4 = -(uint)(pcVar5 == (char *)0x0) | (int)pcVar5 - iVar12;
  if ((int)uVar4 < (int)uVar14) {
    uVar4 = uVar14;
  }
  i = uVar4 + 1;
  if ((int)uVar4 < 0) {
    i = 0;
  }
  pcVar5 = strrchr(paVar10->_space,0x2e);
  uVar4 = -(uint)(pcVar5 == (char *)0x0) | (int)pcVar5 - iVar12;
  if ((int)uVar4 < 0) {
    uVar4 = in_RSI->_len;
  }
  String::substring(&local_d0,in_RSI,i,uVar4);
  bVar1 = this->_useconsole;
  __mutex = (pthread_mutex_t *)this->_mutex;
  pthread_mutex_lock(__mutex);
  iVar12 = (this->_logfile)._len;
  String::alloc(&local_148,iVar12);
  uVar11 = local_148.field_2._str;
  if (local_148._size == 0) {
    uVar11 = &local_148.field_2;
  }
  if ((this->_logfile)._size == 0) {
    paVar10 = &(this->_logfile).field_2;
  }
  else {
    paVar10 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->_logfile).field_2._str;
  }
  local_148._len = iVar12;
  memcpy((void *)uVar11,paVar10,(long)iVar12 + 1);
  bVar2 = this->_usefile;
  if (bVar2 == true) {
    File::File(&local_78,&local_148);
    LVar6 = File::size(&local_78);
    bVar3 = 1000000 < LVar6;
  }
  else {
    bVar3 = false;
  }
  if (bVar2 != false) {
    File::~File(&local_78);
  }
  if (bVar3) {
    Path::Path((Path *)&local_180,&local_148);
    Path::noExt(&local_98,(Path *)&local_180);
    Path::operator+((Path *)local_e8,&local_98,"-1.");
    Path::extension(&local_b0,(Path *)&local_180);
    Path::operator+((Path *)local_130,(Path *)local_e8,&local_b0);
    String::alloc(&local_160,local_130._4_4_);
    local_160._len = local_130._4_4_;
    uVar11 = local_160.field_2._str;
    if (local_160._size == 0) {
      uVar11 = &local_160.field_2;
    }
    pcVar5 = (char *)local_130._8_8_;
    if (local_130._0_4_ == 0) {
      pcVar5 = local_130 + 8;
    }
    memcpy((void *)uVar11,pcVar5,(long)(int)local_130._4_4_ + 1);
    if (local_130._0_4_ != 0) {
      free((void *)local_130._8_8_);
    }
    if (local_b0._size != 0) {
      free(local_b0.field_2._str);
    }
    if (local_e8._0_4_ != 0) {
      free((void *)local_e8._8_8_);
    }
    if (local_98._path._size != 0) {
      free(local_98._path.field_2._str);
    }
    File::File((File *)local_130,&local_160);
    local_110 = -1;
    File::creationDate((File *)local_e8);
    local_b8._t = (double)CONCAT44(local_e8._4_4_,local_e8._0_4_);
    File::~File((File *)local_130);
    if ((local_b8._t != 0.0) || (NAN(local_b8._t))) {
      Directory::remove((char *)&local_160);
    }
    Directory::move(&local_148,&local_160);
    if (local_160._size != 0) {
      free(local_160.field_2._str);
    }
    if (local_180._size != 0) {
      free(local_180.field_2._str);
    }
  }
  bVar13 = 0;
  pcVar5 = "";
  switch(in_EDX) {
  case 0:
    color = BRED;
    bVar13 = 1;
    pcVar5 = "ERROR: ";
    break;
  case 1:
    color = BYELLOW;
    bVar13 = 1;
    pcVar5 = "WARNING: ";
    break;
  default:
    color = COLOR_DEFAULT;
    break;
  case 3:
    color = GREEN;
    goto LAB_0013b93f;
  case 4:
    color = CYAN;
LAB_0013b93f:
    bVar13 = 1;
  }
  if ((bVar13 & bVar1) == 1) {
    Console::color((Console *)&console,color);
  }
  Date::toString((String *)local_130,&local_80,LONG,false);
  pcVar8 = (char *)local_130._8_8_;
  if (local_130._0_4_ == 0) {
    pcVar8 = local_130 + 8;
  }
  uVar11 = local_d0.field_2._str;
  if (local_d0._size == 0) {
    uVar11 = &local_d0.field_2;
  }
  piVar9 = local_168 + 2;
  piVar7 = piVar9;
  if (*local_168 != 0) {
    piVar7 = *(int **)(local_168 + 2);
  }
  String::String(&local_180,0,"[%s][%s] %s%s\n",pcVar8,uVar11,pcVar5,piVar7);
  if (local_130._0_4_ != 0) {
    free((void *)local_130._8_8_);
  }
  if (0 < (long)local_168[1]) {
    if (*local_168 != 0) {
      piVar9 = *(int **)(local_168 + 2);
    }
    if (*(char *)((long)piVar9 + (long)local_168[1] + -1) == '\n') {
      String::resize(&local_180,local_180._len + -1,true,true);
    }
  }
  if (this->_usefile == true) {
    File::File((File *)local_130,&this->_logfile);
    TextFile::append((TextFile *)local_130,&local_180);
    File::~File((File *)local_130);
  }
  if ((bVar1 != false) && (printf("%s"), bVar13 != 0)) {
    Console::color((Console *)&console,COLOR_DEFAULT);
  }
  if (local_180._size != 0) {
    free(local_180.field_2._str);
  }
  if (local_148._size != 0) {
    free(local_148.field_2._str);
  }
  pthread_mutex_unlock(__mutex);
  dVar15 = extraout_XMM0_Qa_00;
  if (local_d0._size != 0) {
    free(local_d0.field_2._str);
    dVar15 = extraout_XMM0_Qa_01;
  }
  return dVar15;
}

Assistant:

void Log::log(const String& cat, Log::Level level, const String& message)
{
	updateState();
	if (level > _maxLevel)
		return;

	Date now = Date::now();

	// remove directory and extension, so __FILE__ can be used as category
	int slash = max(cat.lastIndexOf('\\'), cat.lastIndexOf('/'));
	int i0 = (slash<0) ? 0 : slash + 1;
	int dot = cat.lastIndexOf('.');
	int i1 = (dot<0) ? cat.length() : dot;
	String catg = cat.substring(i0, i1);
	bool useconsole = _useconsole;

	Lock lock(*_mutex);

#ifndef __ANDROID_API__
	String logfile = _logfile;
	if (_usefile && TextFile(logfile).size() > ASL_LOG_MAX_SIZE)
	{
		Path   path = logfile;
		String oldfile = path.noExt() + "-1." + path.extension();
		if (File(oldfile).exists())
			Directory::remove(oldfile);
		Directory::move(logfile, oldfile);
	}
#endif

	const char* slevel = "";
	Console::Color color = Console::COLOR_DEFAULT;

	switch (level)
	{
	case Log::WARNING:
		slevel = "WARNING: ";
		color = Console::BYELLOW;
		break;
	case Log::ERR:
		slevel = "ERROR: ";
		color = Console::BRED;
		break;
	case Log::DEBUG:
		color = Console::GREEN;
		break;
	case Log::VERBOSE:
		color = Console::CYAN;
		break;
	default:
		break;
	}

	if (useconsole && color != Console::COLOR_DEFAULT)
		console.color(color);

	String line(0, "[%s][%s] %s%s\n", *now.toString(), *catg, slevel, *message);

	if (message.endsWith('\n'))
		line.resize(line.length() - 1);

	if (_usefile)
		TextFile(_logfile).append(line);

	if (useconsole)
	{
		printf("%s", *line);
		if (color != Console::COLOR_DEFAULT)
			console.color();
	}
}